

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O1

void cf2_doStems(CF2_Font font,CF2_Stack opStack,CF2_ArrStack stemHintArray,CF2_F16Dot16 *width,
                FT_Bool *haveWidth,CF2_F16Dot16 hintOffset)

{
  undefined8 uVar1;
  CF2_F16Dot16 CVar2;
  CF2_F16Dot16 CVar3;
  FT_UFast idx;
  ulong uVar4;
  undefined1 local_64 [4];
  int local_60;
  CF2_StemHintRec stemhint;
  
  uVar4 = (ulong)((long)opStack->top - (long)opStack->buffer) >> 3;
  idx = (uint)uVar4 & 1;
  if (((font->isT1 == '\0') && ((uVar4 & 1) != 0)) && (*haveWidth == '\0')) {
    CVar2 = cf2_stack_getReal(opStack,0);
    *width = (int)(font->decoder->current_subfont->private_dict).nominal_width * 0x10000 + CVar2;
  }
  if (font->decoder->width_only == '\0') {
    stemhint._12_8_ = uVar4;
    if (1 < (uint)uVar4) {
      do {
        CVar2 = cf2_stack_getReal(opStack,idx);
        local_60 = CVar2 + hintOffset;
        CVar3 = cf2_stack_getReal(opStack,idx + 1);
        uVar1 = stemhint._12_8_;
        hintOffset = CVar3 + CVar2 + hintOffset;
        local_64[0] = 0;
        stemhint.min = 0;
        stemhint.max = 0;
        stemhint._0_4_ = hintOffset;
        cf2_arrstack_push(stemHintArray,local_64);
        idx = idx + 2;
      } while (idx < (uint)uVar1);
    }
    opStack->top = opStack->buffer;
  }
  *haveWidth = '\x01';
  return;
}

Assistant:

static void
  cf2_doStems( const CF2_Font  font,
               CF2_Stack       opStack,
               CF2_ArrStack    stemHintArray,
               CF2_Fixed*      width,
               FT_Bool*        haveWidth,
               CF2_Fixed       hintOffset )
  {
    CF2_UInt  i;
    CF2_UInt  count       = cf2_stack_count( opStack );
    FT_Bool   hasWidthArg = (FT_Bool)( count & 1 );

    /* variable accumulates delta values from operand stack */
    CF2_Fixed  position = hintOffset;

    if ( font->isT1 && !font->decoder->flex_state && !*haveWidth )
      FT_ERROR(( "cf2_doStems (Type 1 mode):"
                 " No width. Use hsbw/sbw as first op\n" ));

    if ( !font->isT1 && hasWidthArg && !*haveWidth )
      *width = ADD_INT32( cf2_stack_getReal( opStack, 0 ),
                          cf2_getNominalWidthX( font->decoder ) );

    if ( font->decoder->width_only )
      goto exit;

    for ( i = hasWidthArg ? 1 : 0; i < count; i += 2 )
    {
      /* construct a CF2_StemHint and push it onto the list */
      CF2_StemHintRec  stemhint;


      stemhint.min =
      position     = ADD_INT32( position,
                                cf2_stack_getReal( opStack, i ) );
      stemhint.max =
      position     = ADD_INT32( position,
                                cf2_stack_getReal( opStack, i + 1 ) );

      stemhint.used  = FALSE;
      stemhint.maxDS =
      stemhint.minDS = 0;

      cf2_arrstack_push( stemHintArray, &stemhint ); /* defer error check */
    }

    cf2_stack_clear( opStack );

  exit:
    /* cf2_doStems must define a width (may be default) */
    *haveWidth = TRUE;
  }